

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

Range * getVoronoiSrcRange(Range r)

{
  Range *in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int ty;
  int z;
  int x;
  
  if (in_stack_00000008 != 1) {
    printf("getVoronoiSrcRange() expects input range with scale 1:1\n");
    exit(1);
  }
  in_RDI->scale = 4;
  in_RDI->x = in_stack_0000000c + -2 >> 2;
  in_RDI->z = in_stack_00000010 + -2 >> 2;
  in_RDI->sx = ((in_stack_0000000c + -2 + in_stack_00000014 >> 2) - in_RDI->x) + 2;
  in_RDI->sz = ((in_stack_00000010 + -2 + in_stack_00000018 >> 2) - in_RDI->z) + 2;
  if (z < 1) {
    in_RDI->sy = 0;
    in_RDI->y = 0;
  }
  else {
    in_RDI->y = ty + -2 >> 2;
    in_RDI->sy = ((ty + -2 + z >> 2) - in_RDI->y) + 2;
  }
  return in_RDI;
}

Assistant:

Range getVoronoiSrcRange(Range r)
{
    if (r.scale != 1)
    {
        printf("getVoronoiSrcRange() expects input range with scale 1:1\n");
        exit(1);
    }

    Range s; // output has scale 1:4
    int x = r.x - 2;
    int z = r.z - 2;
    s.scale = 4;
    s.x = x >> 2;
    s.z = z >> 2;
    s.sx = ((x + r.sx) >> 2) - s.x + 2;
    s.sz = ((z + r.sz) >> 2) - s.z + 2;
    if (r.sy < 1)
    {
        s.y = s.sy = 0;
    }
    else
    {
        int ty = r.y - 2;
        s.y = ty >> 2;
        s.sy = ((ty + r.sy) >> 2) - s.y + 2;
    }
    return s;
}